

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

IndirOpnd * __thiscall
Lowerer::GetArgsIndirOpndForInlinee(Lowerer *this,Instr *ldElem,Opnd *valueOpnd)

{
  StackSym *stackSym;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  BYTE scale;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  RegOpnd *dst;
  IndirOpnd *pIVar6;
  undefined1 local_60 [8];
  AutoReuseOpnd autoReuseFirstArg;
  AutoReuseOpnd autoReuseBaseOpnd;
  
  bVar2 = Func::IsInlinee(ldElem->m_func);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5637,"(ldElem->m_func->IsInlinee())","ldElem->m_func->IsInlinee()");
    if (!bVar2) goto LAB_005ecd64;
    *puVar4 = 0;
  }
  pSVar5 = Func::GetInlineeArgvSlotOpnd(ldElem->m_func);
  stackSym = (StackSym *)pSVar5->m_sym;
  if ((stackSym->super_Sym).m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar2) goto LAB_005ecd64;
    *puVar4 = 0;
  }
  Func::SetArgOffset(this->m_func,stackSym,stackSym->m_offset + 8);
  pSVar5 = IR::SymOpnd::New((Sym *)stackSym,TyUint64,ldElem->m_func);
  local_60 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_60,&pSVar5->super_Opnd,this->m_func,true);
  dst = IR::RegOpnd::New(TyInt64,ldElem->m_func);
  autoReuseFirstArg.autoDelete = false;
  autoReuseFirstArg.wasInUse = false;
  autoReuseFirstArg._18_6_ = 0;
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseFirstArg.autoDelete,&dst->super_Opnd,this->m_func,true);
  InsertLea(dst,&pSVar5->super_Opnd,ldElem);
  OVar3 = IR::Opnd::GetKind(valueOpnd);
  if (OVar3 == OpndKindIntConst) {
    OVar3 = IR::Opnd::GetKind(valueOpnd);
    if (OVar3 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar2) {
LAB_005ecd64:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pIVar6 = IR::IndirOpnd::New(dst,*(int *)&valueOpnd[1]._vptr_Opnd << 3,TyInt64,ldElem->m_func,
                                false);
  }
  else {
    OVar3 = IR::Opnd::GetKind(valueOpnd);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x564c,"(valueOpnd->IsRegOpnd())","valueOpnd->IsRegOpnd()");
      if (!bVar2) goto LAB_005ecd64;
      *puVar4 = 0;
    }
    scale = LowererMDArch::GetDefaultIndirScale();
    OVar3 = IR::Opnd::GetKind(valueOpnd);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_005ecd64;
      *puVar4 = 0;
    }
    pIVar6 = IR::IndirOpnd::New(dst,(RegOpnd *)valueOpnd,scale,TyInt64,ldElem->m_func);
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseFirstArg.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_60);
  return pIVar6;
}

Assistant:

IR::IndirOpnd*
Lowerer::GetArgsIndirOpndForInlinee(IR::Instr* ldElem, IR::Opnd* valueOpnd)
{
    Assert(ldElem->m_func->IsInlinee());
    IR::IndirOpnd* argIndirOpnd = nullptr;

    // Address of argument after 'this'
    const auto firstRealArgStackSym = ldElem->m_func->GetInlineeArgvSlotOpnd()->m_sym->AsStackSym();
    this->m_func->SetArgOffset(firstRealArgStackSym, firstRealArgStackSym->m_offset + MachPtr); //Start after this pointer
    IR::SymOpnd *firstArg = IR::SymOpnd::New(firstRealArgStackSym, TyMachPtr, ldElem->m_func);
    const IR::AutoReuseOpnd autoReuseFirstArg(firstArg, m_func);

    IR::RegOpnd *const baseOpnd = IR::RegOpnd::New(TyMachReg, ldElem->m_func);
    const IR::AutoReuseOpnd autoReuseBaseOpnd(baseOpnd, m_func);
    InsertLea(baseOpnd, firstArg, ldElem);

    if (valueOpnd->IsIntConstOpnd())
    {
        IntConstType offset = valueOpnd->AsIntConstOpnd()->GetValue() * MachPtr;
        // TODO: Assert(Math::FitsInDWord(offset));
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd, (int32)offset, TyMachReg, ldElem->m_func);
    }
    else
    {
        Assert(valueOpnd->IsRegOpnd());
        const BYTE indirScale = this->m_lowererMD.GetDefaultIndirScale();
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd, valueOpnd->AsRegOpnd(), indirScale, TyMachReg, ldElem->m_func);
    }
    return argIndirOpnd;
}